

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O0

void anon_unknown.dwarf_64299::AssertInt32Equals
               (uint32_t expected,char *s,ParseIntTypeCombo parse_type)

{
  ParseIntTypeCombo parse_type_local;
  char *s_local;
  uint32_t expected_local;
  
  AssertIntEquals<unsigned_int>(expected,s,wabt::ParseInt32,parse_type);
  return;
}

Assistant:

void AssertInt32Equals(uint32_t expected,
                       const char* s,
                       ParseIntTypeCombo parse_type = Both) {
  AssertIntEquals(expected, s, ParseInt32, parse_type);
}